

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompilationUnitSymbols.cpp
# Opt level: O1

PackageSymbol *
slang::ast::PackageSymbol::fromSyntax
          (Scope *scope,ModuleDeclarationSyntax *syntax,NetType *defaultNetType,
          optional<slang::TimeScale> directiveTimeScale)

{
  SyntaxKind SVar1;
  Compilation *args;
  ModuleHeaderSyntax *pMVar2;
  size_t sVar3;
  TimeUnitsDeclarationSyntax *syntax_00;
  Token token;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  optional<slang::SourceRange> unitsRange_00;
  optional<slang::SourceRange> precisionRange_00;
  int iVar4;
  optional<slang::ast::VariableLifetime> oVar5;
  PackageSymbol *this;
  pointer ppMVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar7;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX_02;
  bool isFirst;
  byte *pbVar8;
  ulong uVar9;
  long lVar10;
  pointer ppMVar11;
  PackageImportItemSyntax *item;
  optional<slang::SourceRange> precisionRange;
  optional<slang::SourceRange> unitsRange;
  SmallVector<const_slang::syntax::PackageImportItemSyntax_*,_5UL> exportDecls;
  PackageImportItemSyntax *local_a8;
  _Storage<slang::SourceRange,_true> local_a0;
  undefined1 local_90;
  undefined7 uStack_8f;
  _Storage<slang::SourceRange,_true> local_88;
  undefined1 local_78;
  undefined7 uStack_77;
  SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*> local_70 [2];
  
  args = scope->compilation;
  pMVar2 = (syntax->header).ptr;
  token.kind = (pMVar2->lifetime).kind;
  token._2_1_ = (pMVar2->lifetime).field_0x2;
  token.numFlags.raw = (pMVar2->lifetime).numFlags.raw;
  token.rawLen = (pMVar2->lifetime).rawLen;
  token.info = (pMVar2->lifetime).info;
  oVar5 = SemanticFacts::getVariableLifetime(token);
  local_70[0]._0_16_ = (undefined1  [16])parsing::Token::valueText(&((syntax->header).ptr)->name);
  local_88._M_value.startLoc = parsing::Token::location(&((syntax->header).ptr)->name);
  local_a0._0_4_ = Static;
  if (((ulong)oVar5.super__Optional_base<slang::ast::VariableLifetime,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::VariableLifetime> >> 0x20 & 1) != 0) {
    local_a0._0_4_ =
         oVar5.super__Optional_base<slang::ast::VariableLifetime,_true,_true>._M_payload.
         super__Optional_payload_base<slang::ast::VariableLifetime>._M_payload;
  }
  this = BumpAllocator::
         emplace<slang::ast::PackageSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::NetType_const&,slang::ast::VariableLifetime>
                   (&args->super_BumpAllocator,args,
                    (basic_string_view<char,_std::char_traits<char>_> *)local_70,
                    &local_88._M_value.startLoc,defaultNetType,(VariableLifetime *)&local_a0);
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_01._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_01._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&this->super_Symbol,scope,syntax_01);
  local_78 = 0;
  local_90 = 0;
  local_70[0].len = 0;
  local_70[0].data_ = (pointer)((long)local_70 + 0x18);
  local_70[0].cap = 5;
  sVar3 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
          _M_extent._M_extent_value;
  src = extraout_RDX;
  if (sVar3 != 0) {
    ppMVar11 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
               _M_ptr;
    ppMVar6 = ppMVar11 + sVar3;
    isFirst = true;
    do {
      syntax_00 = (TimeUnitsDeclarationSyntax *)*ppMVar11;
      SVar1 = (syntax_00->super_MemberSyntax).super_SyntaxNode.kind;
      if (SVar1 == PackageExportAllDeclaration) {
        this->hasExportAll = true;
LAB_004f833a:
        Scope::addMembers(&this->super_Scope,(SyntaxNode *)syntax_00);
        isFirst = false;
        src = extraout_RDX_01;
      }
      else {
        if (SVar1 == PackageExportDeclaration) {
          pbVar8 = (byte *)((long)&(syntax_00[1].super_MemberSyntax.super_SyntaxNode.parent)->kind +
                           1);
          if ((byte *)0x1 < pbVar8) {
            uVar9 = (ulong)pbVar8 >> 1;
            lVar10 = 0;
            do {
              ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                  ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    *)(*(long *)&syntax_00[1].super_MemberSyntax.super_SyntaxNode +
                                      lVar10));
              local_a8 = (PackageImportItemSyntax *)*ppSVar7;
              SmallVectorBase<slang::syntax::PackageImportItemSyntax_const*>::
              emplace_back<slang::syntax::PackageImportItemSyntax_const*const&>
                        ((SmallVectorBase<slang::syntax::PackageImportItemSyntax_const*> *)local_70,
                         &local_a8);
              lVar10 = lVar10 + 0x30;
              uVar9 = uVar9 - 1;
            } while (uVar9 != 0);
          }
          goto LAB_004f833a;
        }
        if (SVar1 != TimeUnitsDeclaration) goto LAB_004f833a;
        if ((this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
            super__Optional_payload_base<slang::TimeScale>._M_engaged == false) {
          (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeScale>._M_payload =
               (_Storage<slang::TimeScale,_true>)0x1030103;
          (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeScale>._M_engaged = true;
        }
        SemanticFacts::populateTimeScale
                  ((TimeScale *)&this->timeScale,scope,syntax_00,
                   (optional<slang::SourceRange> *)&local_88._M_value,
                   (optional<slang::SourceRange> *)&local_a0._M_value,isFirst);
        src = extraout_RDX_00;
      }
      ppMVar11 = ppMVar11 + 1;
    } while (ppMVar11 != ppMVar6);
  }
  iVar4 = SmallVectorBase<const_slang::syntax::PackageImportItemSyntax_*>::copy
                    (local_70,(EVP_PKEY_CTX *)args,src);
  (this->exportDecls)._M_ptr = (pointer)CONCAT44(extraout_var,iVar4);
  (this->exportDecls)._M_extent._M_extent_value = extraout_RDX_02;
  precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_8f;
  precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_engaged = (bool)local_90;
  precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._4_4_ = local_a0._4_4_;
  precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._0_4_ = local_a0._0_4_;
  unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._17_7_ = uStack_77;
  unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_engaged = (bool)local_78;
  unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
       local_88._M_value.endLoc;
  unitsRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
       local_88._M_value.startLoc;
  precisionRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
       local_a0._M_value.endLoc;
  SemanticFacts::populateTimeScale
            (&this->timeScale,scope,directiveTimeScale,unitsRange_00,precisionRange_00);
  if (local_70[0].data_ != (pointer)((long)local_70 + 0x18U)) {
    operator_delete(local_70[0].data_);
  }
  return this;
}

Assistant:

PackageSymbol& PackageSymbol::fromSyntax(const Scope& scope, const ModuleDeclarationSyntax& syntax,
                                         const NetType& defaultNetType,
                                         std::optional<TimeScale> directiveTimeScale) {
    auto& comp = scope.getCompilation();
    auto lifetime = SemanticFacts::getVariableLifetime(syntax.header->lifetime);
    auto result = comp.emplace<PackageSymbol>(comp, syntax.header->name.valueText(),
                                              syntax.header->name.location(), defaultNetType,
                                              lifetime.value_or(VariableLifetime::Static));
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    bool first = true;
    std::optional<SourceRange> unitsRange;
    std::optional<SourceRange> precisionRange;
    SmallVector<const PackageImportItemSyntax*> exportDecls;

    for (auto member : syntax.members) {
        if (member->kind == SyntaxKind::TimeUnitsDeclaration) {
            if (!result->timeScale)
                result->timeScale.emplace();

            SemanticFacts::populateTimeScale(*result->timeScale, scope,
                                             member->as<TimeUnitsDeclarationSyntax>(), unitsRange,
                                             precisionRange, first);
            continue;
        }

        first = false;

        if (member->kind == SyntaxKind::PackageExportAllDeclaration) {
            result->hasExportAll = true;
        }
        else if (member->kind == SyntaxKind::PackageExportDeclaration) {
            for (auto item : member->as<PackageExportDeclarationSyntax>().items)
                exportDecls.push_back(item);
        }

        result->addMembers(*member);
    }

    result->exportDecls = exportDecls.copy(comp);

    SemanticFacts::populateTimeScale(result->timeScale, scope, directiveTimeScale, unitsRange,
                                     precisionRange);
    return *result;
}